

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExprComponents * __thiscall
Catch::ExpressionResultBuilder::ExprComponents::operator=
          (ExprComponents *this,ExprComponents *param_1)

{
  this->shouldNegate = param_1->shouldNegate;
  std::__cxx11::string::_M_assign((string *)&this->lhs);
  std::__cxx11::string::_M_assign((string *)&this->rhs);
  std::__cxx11::string::_M_assign((string *)&this->op);
  return this;
}

Assistant:

ExprComponents() : shouldNegate( false ) {}